

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

qint64 __thiscall
QHexView::replace(QHexView *this,QVariant *oldvalue,QVariant *newvalue,qint64 offset,
                 QHexFindMode mode,uint options,QHexFindDirection fd)

{
  long offset_00;
  QPair<qint64,_qint64> QVar1;
  QVariant local_68;
  QVariant local_48;
  
  QVariant::QVariant(&local_48,oldvalue);
  QVariant::QVariant(&local_68,newvalue);
  QVar1 = QHexUtils::replace(this,&local_48,&local_68,offset,mode,options,fd);
  offset_00 = QVar1.first;
  QVariant::~QVariant(&local_68);
  QVariant::~QVariant(&local_48);
  if (-1 < offset_00) {
    QHexCursor::move(this->m_hexcursor,offset_00);
    QHexCursor::selectSize(this->m_hexcursor,QVar1.second);
  }
  return offset_00;
}

Assistant:

qint64 QHexView::replace(const QVariant& oldvalue, const QVariant& newvalue,
                         qint64 offset, QHexFindMode mode, unsigned int options,
                         QHexFindDirection fd) const {
    auto res =
        QHexUtils::replace(this, oldvalue, newvalue, offset, mode, options, fd);

    if(res.first > -1) {
        m_hexcursor->move(res.first);
        m_hexcursor->selectSize(res.second);
    }

    return res.first;
}